

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O0

int __thiscall
deqp::BlockMultiBasicTypesCase::init(BlockMultiBasicTypesCase *this,EVP_PKEY_CTX *ctx)

{
  UniformBlock *pUVar1;
  BlockMultiBasicTypesCase *extraout_RAX;
  VarType local_298;
  Uniform local_280;
  VarType local_240;
  Uniform local_228;
  VarType local_1e8;
  Uniform local_1d0;
  VarType local_190;
  Uniform local_178;
  UniformBlock *local_138;
  UniformBlock *blockB;
  Uniform local_118;
  VarType local_d8;
  Uniform local_c0;
  VarType local_70;
  Uniform local_58;
  UniformBlock *local_18;
  UniformBlock *blockA;
  BlockMultiBasicTypesCase *this_local;
  
  blockA = (UniformBlock *)this;
  pUVar1 = ub::ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,"BlockA");
  local_18 = pUVar1;
  ub::VarType::VarType(&local_70,TYPE_FLOAT,4);
  ub::Uniform::Uniform(&local_58,"a",&local_70,0);
  ub::UniformBlock::addUniform(pUVar1,&local_58);
  ub::Uniform::~Uniform(&local_58);
  ub::VarType::~VarType(&local_70);
  pUVar1 = local_18;
  ub::VarType::VarType(&local_d8,TYPE_UINT_VEC3,1);
  ub::Uniform::Uniform(&local_c0,"b",&local_d8,0xc00);
  ub::UniformBlock::addUniform(pUVar1,&local_c0);
  ub::Uniform::~Uniform(&local_c0);
  ub::VarType::~VarType(&local_d8);
  pUVar1 = local_18;
  ub::VarType::VarType((VarType *)&blockB,TYPE_FLOAT_MAT2,2);
  ub::Uniform::Uniform(&local_118,"c",(VarType *)&blockB,0);
  ub::UniformBlock::addUniform(pUVar1,&local_118);
  ub::Uniform::~Uniform(&local_118);
  ub::VarType::~VarType((VarType *)&blockB);
  ub::UniformBlock::setInstanceName(local_18,"blockA");
  ub::UniformBlock::setFlags(local_18,this->m_flagsA);
  pUVar1 = ub::ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,"BlockB");
  local_138 = pUVar1;
  ub::VarType::VarType(&local_190,TYPE_FLOAT_MAT3,2);
  ub::Uniform::Uniform(&local_178,"a",&local_190,0);
  ub::UniformBlock::addUniform(pUVar1,&local_178);
  ub::Uniform::~Uniform(&local_178);
  ub::VarType::~VarType(&local_190);
  pUVar1 = local_138;
  ub::VarType::VarType(&local_1e8,TYPE_INT_VEC2,1);
  ub::Uniform::Uniform(&local_1d0,"b",&local_1e8,0);
  ub::UniformBlock::addUniform(pUVar1,&local_1d0);
  ub::Uniform::~Uniform(&local_1d0);
  ub::VarType::~VarType(&local_1e8);
  pUVar1 = local_138;
  ub::VarType::VarType(&local_240,TYPE_FLOAT_VEC4,4);
  ub::Uniform::Uniform(&local_228,"c",&local_240,0xc00);
  ub::UniformBlock::addUniform(pUVar1,&local_228);
  ub::Uniform::~Uniform(&local_228);
  ub::VarType::~VarType(&local_240);
  pUVar1 = local_138;
  ub::VarType::VarType(&local_298,TYPE_BOOL,0);
  ub::Uniform::Uniform(&local_280,"d",&local_298,0);
  ub::UniformBlock::addUniform(pUVar1,&local_280);
  ub::Uniform::~Uniform(&local_280);
  ub::VarType::~VarType(&local_298);
  ub::UniformBlock::setInstanceName(local_138,"blockB");
  ub::UniformBlock::setFlags(local_138,this->m_flagsB);
  if (0 < this->m_numInstances) {
    ub::UniformBlock::setArraySize(local_18,this->m_numInstances);
    ub::UniformBlock::setArraySize(local_138,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init(void)
	{
		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}